

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

StructGet * __thiscall
wasm::Builder::makeStructGet
          (Builder *this,Index index,Expression *ref,MemoryOrder order,Type type,bool signed_)

{
  StructGet *pSVar1;
  
  pSVar1 = MixedArena::alloc<wasm::StructGet>((MixedArena *)(this->wasm + 0x200));
  pSVar1->index = index;
  pSVar1->ref = ref;
  (pSVar1->super_SpecificExpression<(wasm::Expression::Id)66>).super_Expression.type.id = type.id;
  pSVar1->signed_ = signed_;
  pSVar1->order = order;
  wasm::StructGet::finalize();
  return pSVar1;
}

Assistant:

StructGet* makeStructGet(Index index,
                           Expression* ref,
                           MemoryOrder order,
                           Type type,
                           bool signed_ = false) {
    auto* ret = wasm.allocator.alloc<StructGet>();
    ret->index = index;
    ret->ref = ref;
    ret->type = type;
    ret->signed_ = signed_;
    ret->order = order;
    ret->finalize();
    return ret;
  }